

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O2

int __thiscall
CVmObject::getp_sclist
          (CVmObject *this,vm_obj_id_t self,vm_val_t *retval,uint *argc,vm_prop_id_t param_4,
          vm_obj_id_t *param_5)

{
  CVmObjPageEntry *pCVar1;
  vm_datatype_t *pvVar2;
  vm_val_t *pvVar3;
  int iVar4;
  vm_obj_id_t vVar5;
  ulong idx;
  vm_val_t ele_val;
  
  if (getp_sclist(unsigned_int,vm_val_t*,unsigned_int*,unsigned_short,unsigned_int*)::desc == '\0')
  {
    iVar4 = __cxa_guard_acquire(&getp_sclist(unsigned_int,vm_val_t*,unsigned_int*,unsigned_short,unsigned_int*)
                                 ::desc);
    if (iVar4 != 0) {
      getp_sclist::desc.min_argc_ = 0;
      getp_sclist::desc.opt_argc_ = 0;
      getp_sclist::desc.varargs_ = 0;
      __cxa_guard_release(&getp_sclist(unsigned_int,vm_val_t*,unsigned_int*,unsigned_short,unsigned_int*)
                           ::desc);
    }
  }
  iVar4 = get_prop_check_argc(retval,argc,&getp_sclist::desc);
  pvVar3 = sp_;
  if (iVar4 == 0) {
    pvVar2 = &sp_->typ;
    sp_ = sp_ + 1;
    *pvVar2 = VM_OBJ;
    (pvVar3->val).obj = self;
    iVar4 = (*this->_vptr_CVmObject[8])(this,self);
    vVar5 = CVmObjList::create(0,(long)iVar4);
    pCVar1 = G_obj_table_X.pages_[vVar5 >> 0xc];
    for (idx = 0; (long)iVar4 != idx; idx = idx + 1) {
      ele_val.val.intval = (*this->_vptr_CVmObject[9])(this,self,idx & 0xffffffff);
      ele_val.typ = VM_OBJ;
      CVmObjList::cons_set_element((CVmObjList *)(pCVar1 + (vVar5 & 0xfff)),idx,&ele_val);
    }
    sp_ = sp_ + -1;
    retval->typ = VM_OBJ;
    (retval->val).obj = vVar5;
  }
  return 1;
}

Assistant:

int CVmObject::getp_sclist(VMG_ vm_obj_id_t self,
                           vm_val_t *retval, uint *argc,
                           vm_prop_id_t, vm_obj_id_t *)
{
    size_t sc_cnt;
    vm_obj_id_t lst_obj;
    CVmObjList *lstp;
    size_t i;
    static CVmNativeCodeDesc desc(0);

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* push a self-reference for GC protection */
    G_interpreter->push_obj(vmg_ self);

    /* get the number of superclasses */
    sc_cnt = get_superclass_count(vmg_ self);

    /* allocate a list for the results */
    lst_obj = CVmObjList::create(vmg_ FALSE, sc_cnt);
    lstp = (CVmObjList *)vm_objp(vmg_ lst_obj);

    /* build the superclass list */
    for (i = 0 ; i < sc_cnt ; ++i)
    {
        vm_val_t ele_val;

        /* get this superclass */
        ele_val.set_obj(get_superclass(vmg_ self, i));

        /* set the list element */
        lstp->cons_set_element(i, &ele_val);
    }

    /* discard our GC protection */
    G_stk->discard();

    /* return the list */
    retval->set_obj(lst_obj);

    /* handled */
    return TRUE;
}